

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

DecoratorDataHandle __thiscall
Rml::DecoratorStraightGradient::GenerateElementData
          (DecoratorStraightGradient *this,Element *element,BoxArea paint_area)

{
  Vector2f VVar1;
  Vector2f VVar2;
  Colour<unsigned_char,_255,_true> v0;
  Colour<unsigned_char,_255,_true> v1;
  ColourbPremultiplied CVar3;
  ComputedValues *this_00;
  size_type sVar4;
  reference pvVar5;
  RenderManager *this_01;
  RenderManager *mesh_00;
  float fVar6;
  Geometry *geometry;
  int local_e0;
  float t_1;
  int i_1;
  int local_cc;
  float t;
  int i;
  Vector<Vertex> *vertices;
  float fStack_b8;
  Vector2f size;
  Vector2f offset;
  ColourbPremultiplied colour_stop;
  ColourbPremultiplied colour_start;
  ColourbPremultiplied local_94;
  undefined1 local_90 [8];
  Mesh mesh;
  float opacity;
  ComputedValues *computed;
  RenderBox render_box;
  BoxArea paint_area_local;
  Element *element_local;
  DecoratorStraightGradient *this_local;
  
  render_box.border_radius._M_elems[2] = (float)paint_area;
  unique0x1000031f = element;
  Element::GetRenderBox((RenderBox *)((long)&computed + 4),element,paint_area,0);
  this_00 = Element::GetComputedValues(stack0xffffffffffffffe8);
  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = Style::ComputedValues::opacity(this_00);
  Mesh::Mesh((Mesh *)local_90);
  Colour<unsigned_char,_255,_true>::Colour(&local_94,'\0',0xff);
  MeshUtilities::GenerateBackground((Mesh *)local_90,(RenderBox *)((long)&computed + 4),local_94);
  v0 = Colour<unsigned_char,255,false>::ToPremultiplied<std::integral_constant<bool,false>,void>
                 ((Colour<unsigned_char,255,false> *)&this->start,
                  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_);
  v1 = Colour<unsigned_char,255,false>::ToPremultiplied<std::integral_constant<bool,false>,void>
                 ((Colour<unsigned_char,255,false> *)&this->stop,
                  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_);
  VVar1 = RenderBox::GetFillOffset((RenderBox *)((long)&computed + 4));
  VVar2 = RenderBox::GetFillSize((RenderBox *)((long)&computed + 4));
  if (this->direction == Horizontal) {
    for (local_cc = 0;
        sVar4 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size
                          ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)local_90),
        local_cc < (int)sVar4; local_cc = local_cc + 1) {
      pvVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                         ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)local_90,
                          (long)local_cc);
      size.x = VVar1.x;
      vertices._4_4_ = VVar2.x;
      fVar6 = Math::Clamp<float>(((pvVar5->position).x - size.x) / vertices._4_4_,0.0,1.0);
      CVar3 = Math::RoundedLerp(fVar6,v0,v1);
      pvVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                         ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)local_90,
                          (long)local_cc);
      pvVar5->colour = CVar3;
    }
  }
  else if (this->direction == Vertical) {
    for (local_e0 = 0;
        sVar4 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size
                          ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)local_90),
        local_e0 < (int)sVar4; local_e0 = local_e0 + 1) {
      pvVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                         ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)local_90,
                          (long)local_e0);
      size.y = VVar1.y;
      fStack_b8 = VVar2.y;
      fVar6 = Math::Clamp<float>(((pvVar5->position).y - size.y) / fStack_b8,0.0,1.0);
      CVar3 = Math::RoundedLerp(fVar6,v0,v1);
      pvVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                         ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)local_90,
                          (long)local_e0);
      pvVar5->colour = CVar3;
    }
  }
  this_01 = (RenderManager *)operator_new(0x10);
  mesh_00 = Element::GetRenderManager(stack0xffffffffffffffe8);
  RenderManager::MakeGeometry(this_01,(Mesh *)mesh_00);
  Mesh::~Mesh((Mesh *)local_90);
  return (DecoratorDataHandle)this_01;
}

Assistant:

DecoratorDataHandle DecoratorStraightGradient::GenerateElementData(Element* element, BoxArea paint_area) const
{
	const RenderBox render_box = element->GetRenderBox(paint_area);
	const ComputedValues& computed = element->GetComputedValues();
	const float opacity = computed.opacity();

	Mesh mesh;
	MeshUtilities::GenerateBackground(mesh, render_box, ColourbPremultiplied());

	ColourbPremultiplied colour_start = start.ToPremultiplied(opacity);
	ColourbPremultiplied colour_stop = stop.ToPremultiplied(opacity);

	const Vector2f offset = render_box.GetFillOffset();
	const Vector2f size = render_box.GetFillSize();

	Vector<Vertex>& vertices = mesh.vertices;

	if (direction == Direction::Horizontal)
	{
		for (int i = 0; i < (int)vertices.size(); i++)
		{
			const float t = Math::Clamp((vertices[i].position.x - offset.x) / size.x, 0.0f, 1.0f);
			vertices[i].colour = Math::RoundedLerp(t, colour_start, colour_stop);
		}
	}
	else if (direction == Direction::Vertical)
	{
		for (int i = 0; i < (int)vertices.size(); i++)
		{
			const float t = Math::Clamp((vertices[i].position.y - offset.y) / size.y, 0.0f, 1.0f);
			vertices[i].colour = Math::RoundedLerp(t, colour_start, colour_stop);
		}
	}

	Geometry* geometry = new Geometry(element->GetRenderManager()->MakeGeometry(std::move(mesh)));

	return reinterpret_cast<DecoratorDataHandle>(geometry);
}